

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall helics::CloneFilterOperation::CloneFilterOperation(CloneFilterOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__CloneFilterOperation_00556260;
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005567c0;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:461:40)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:461:40)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  CloneOperator::CloneOperator
            ((CloneOperator *)(p_Var1 + 1),
             (function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
              *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CloneOperator *)(p_Var1 + 1);
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deliveryAddresses).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->deliveryAddresses).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  return;
}

Assistant:

CloneFilterOperation::CloneFilterOperation():
    op(std::make_shared<CloneOperator>([this](const Message* mess) { return sendMessage(mess); }))
{
}